

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_iejoin.cpp
# Opt level: O3

idx_t duckdb::NextValid(ValidityMask *bits,idx_t j,idx_t n)

{
  idx_t iVar1;
  sbyte sVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  unsigned_long *puVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  
  if (n <= j) {
    return n;
  }
  uVar3 = (uint)j & 0x3f;
  uVar5 = (ulong)uVar3;
  if (bits == (ValidityMask *)0x0) {
    puVar6 = (unsigned_long *)0xffffffffffffffff;
  }
  else {
    puVar6 = (&(bits->super_TemplatedValidityMask<unsigned_long>).validity_mask)[j >> 6];
  }
  sVar2 = (sbyte)uVar3;
  puVar6 = (unsigned_long *)(((ulong)puVar6 >> sVar2) << sVar2);
  uVar9 = n + 0x3f >> 6;
  uVar7 = (j >> 6) + 1;
  uVar8 = uVar5;
  if (uVar7 < uVar9) {
    bVar10 = true;
    uVar8 = 0;
    iVar1 = j;
    do {
      j = iVar1;
      uVar4 = uVar5;
      if (puVar6 != (unsigned_long *)0x0) {
        do {
          if (((ulong)puVar6 >> (uVar4 & 0x3f) & 1) != 0) {
            uVar8 = uVar4;
            if (bVar10) {
              return j;
            }
            goto LAB_00bc70f4;
          }
          uVar4 = uVar4 + 1;
          j = j + 1;
        } while (uVar4 != 0x40);
      }
      j = (iVar1 - uVar5) + 0x40;
      if (bits == (ValidityMask *)0x0) {
        puVar6 = (unsigned_long *)0xffffffffffffffff;
      }
      else {
        puVar6 = (&(bits->super_TemplatedValidityMask<unsigned_long>).validity_mask)[uVar7];
      }
      uVar7 = uVar7 + 1;
      uVar5 = 0;
      bVar10 = uVar7 < uVar9;
      iVar1 = j;
    } while (uVar7 != uVar9);
  }
LAB_00bc70f4:
  uVar5 = j;
  if (j < n) {
    do {
      if (((ulong)puVar6 >> (uVar8 & 0x3f) & 1) != 0) {
        return uVar5;
      }
      uVar8 = uVar8 + 1;
      uVar5 = uVar5 + 1;
      j = n;
    } while (n != uVar5);
  }
  return j;
}

Assistant:

static idx_t NextValid(const ValidityMask &bits, idx_t j, const idx_t n) {
	if (j >= n) {
		return n;
	}

	// We can do a first approximation by checking entries one at a time
	// which gives 64:1.
	idx_t entry_idx, idx_in_entry;
	bits.GetEntryIndex(j, entry_idx, idx_in_entry);
	auto entry = bits.GetValidityEntry(entry_idx++);

	// Trim the bits before the start position
	entry &= (ValidityMask::ValidityBuffer::MAX_ENTRY << idx_in_entry);

	// Check the non-ragged entries
	for (const auto entry_count = bits.EntryCount(n); entry_idx < entry_count; ++entry_idx) {
		if (entry) {
			for (; idx_in_entry < bits.BITS_PER_VALUE; ++idx_in_entry, ++j) {
				if (bits.RowIsValid(entry, idx_in_entry)) {
					return j;
				}
			}
		} else {
			j += bits.BITS_PER_VALUE - idx_in_entry;
		}

		entry = bits.GetValidityEntry(entry_idx);
		idx_in_entry = 0;
	}

	// Check the final entry
	for (; j < n; ++idx_in_entry, ++j) {
		if (bits.RowIsValid(entry, idx_in_entry)) {
			return j;
		}
	}

	return j;
}